

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osMutex.cpp
# Opt level: O0

void osMutex::dump_info(ostream *out)

{
  osMutex *poVar1;
  char *pcVar2;
  _Setw _Var3;
  ostream *poVar4;
  string local_c0 [8];
  string file;
  int local_9c;
  string local_98 [4];
  int line;
  string owner;
  string local_78 [8];
  string state;
  allocator local_41;
  string local_40 [8];
  string name;
  osMutex *mutex;
  int i;
  ostream *out_local;
  
  std::operator<<(out,
                  "--------------------+-------+--------------------+------+--------------------\n")
  ;
  std::operator<<(out," Name               | State | Owner              | Line | File\n");
  std::operator<<(out,
                  "--------------------+-------+--------------------+------+--------------------\n")
  ;
  LockListMutex();
  for (mutex._4_4_ = 0; mutex._4_4_ < 0x10; mutex._4_4_ = mutex._4_4_ + 1) {
    poVar1 = MutexList[mutex._4_4_];
    if (poVar1 != (osMutex *)0x0) {
      pcVar2 = poVar1->Name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar2,&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      std::__cxx11::string::string(local_78);
      std::__cxx11::string::string(local_98);
      local_9c = -1;
      std::__cxx11::string::string(local_c0);
      if (poVar1->OwnerFile != (char *)0x0) {
        local_9c = poVar1->OwnerLine;
        std::__cxx11::string::operator=(local_c0,poVar1->OwnerFile);
      }
      _Var3 = std::setw(0x14);
      poVar4 = std::operator<<(out,_Var3);
      poVar4 = std::operator<<(poVar4,local_40);
      _Var3 = std::setw(0);
      poVar4 = std::operator<<(poVar4,_Var3);
      std::operator<<(poVar4,"|");
      _Var3 = std::setw(7);
      poVar4 = std::operator<<(out,_Var3);
      poVar4 = std::operator<<(poVar4,local_78);
      _Var3 = std::setw(0);
      poVar4 = std::operator<<(poVar4,_Var3);
      std::operator<<(poVar4,"|");
      _Var3 = std::setw(0x14);
      poVar4 = std::operator<<(out,_Var3);
      poVar4 = std::operator<<(poVar4,local_98);
      _Var3 = std::setw(0);
      poVar4 = std::operator<<(poVar4,_Var3);
      std::operator<<(poVar4,"|");
      _Var3 = std::setw(6);
      poVar4 = std::operator<<(out,_Var3);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_9c);
      _Var3 = std::setw(0);
      poVar4 = std::operator<<(poVar4,_Var3);
      std::operator<<(poVar4,"|");
      _Var3 = std::setw(0);
      poVar4 = std::operator<<(out,_Var3);
      poVar4 = std::operator<<(poVar4,local_c0);
      _Var3 = std::setw(0);
      poVar4 = std::operator<<(poVar4,_Var3);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_40);
    }
  }
  UnlockListMutex();
  return;
}

Assistant:

void osMutex::dump_info(std::ostream& out)
{
    out << "--------------------+-------+--------------------+------+--------------------\n";
    out << " Name               | State | Owner              | Line | File\n";
    out << "--------------------+-------+--------------------+------+--------------------\n";

    LockListMutex();
    for (int i = 0; i < MAX_MUTEX; i++)
    {
        osMutex* mutex = MutexList[i];
        if (mutex != nullptr)
        {
            std::string name = mutex->Name;
            std::string state;
            std::string owner;
            int line = -1;
            std::string file;
            if (mutex->OwnerFile)
            {
                line = mutex->OwnerLine;
                file = mutex->OwnerFile;
            }
            out << std::setw(20) << name << std::setw(0) << "|";
            out << std::setw(7) << state << std::setw(0) << "|";
            out << std::setw(20) << owner << std::setw(0) << "|";
            out << std::setw(6) << line << std::setw(0) << "|";
            out << std::setw(0) << file << std::setw(0) << "\n";
        }
    }
    UnlockListMutex();
}